

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O2

double GetHeaderInformation(char *filename,char *parameter)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  double dVar3;
  int answer;
  undefined4 uStack_3c;
  char data_check [5];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
LAB_0010b8e6:
    dVar3 = 0.0;
  }
  else {
    data_check[4] = '\0';
    iVar2 = 0xe;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) goto LAB_0010b8e6;
      fread(data_check,1,4,__stream);
      iVar1 = strcmp(data_check,parameter);
    } while (iVar1 != 0);
    iVar2 = strcmp(parameter,"FP  ");
    if (iVar2 == 0) {
      fread(&answer,8,1,__stream);
      fclose(__stream);
      dVar3 = (double)CONCAT44(uStack_3c,answer);
    }
    else {
      fread(&answer,4,1,__stream);
      fclose(__stream);
      dVar3 = (double)answer;
    }
  }
  return dVar3;
}

Assistant:

double GetHeaderInformation(const char *filename, const char *parameter) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  char data_check[5];
  data_check[4] = '\0';
  for (int i = 0; i < 13; ++i) {
    fread(data_check, 1, 4, fp);
    if (0 != strcmp(data_check, parameter)) continue;
    if (0 == strcmp(parameter, "FP  ")) {
      double answer;
      fread(&answer, 8, 1, fp);
      fclose(fp);
      return answer;
    } else {
      int answer;
      fread(&answer, 4, 1, fp);
      fclose(fp);
      return static_cast<double>(answer);
    }
  }
  return 0;
}